

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareLineCos2Distance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2,
              Vector3<double> *n,double n1,double n2)

{
  double dVar1;
  __type_conflict _Var2;
  double dVar3;
  uint local_bc;
  double error;
  double diff;
  double m2_error;
  double m1_error;
  double m1;
  double local_70;
  double m2;
  double n2cos2_r_error;
  double n2cos2_r;
  double cos_r;
  double T_ERR;
  double n2_local;
  double n1_local;
  Vector3<double> *n_local;
  double r2_local;
  Vector3<double> *a1_local;
  Vector3<double> *a0_local;
  Vector3<double> *x_local;
  
  cos_r = 1.1102230246251565e-16;
  if (r2 < 2.0) {
    n2cos2_r = 1.0 - r2 * 0.5;
    n2cos2_r_error = n2 * n2cos2_r * n2cos2_r;
    m2 = n2cos2_r_error * 7.771561172376096e-16;
    T_ERR = n2;
    n2_local = n1;
    n1_local = (double)n;
    n_local = (Vector3<double> *)r2;
    r2_local = (double)a1;
    a1_local = a0;
    a0_local = x;
    Vector3<double>::CrossProd((Vector3<double> *)&m1,x,n);
    local_70 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                         ((BasicVector<Vector3,_double,_3UL> *)&m1);
    dVar1 = sqrt(local_70);
    _Var2 = std::sqrt<int>(3);
    dVar3 = (8.0 / _Var2 + 1.0) * n2_local;
    _Var2 = std::sqrt<int>(3);
    dVar3 = (dVar3 + _Var2 * 32.0 * 1.1102230246251565e-16) * 1.1102230246251565e-16;
    dVar1 = local_70 * 3.3306690738754696e-16 + (dVar1 * 2.0 + dVar3) * dVar3 +
            n2cos2_r_error * 8.881784197001252e-16 + m2;
    if (local_70 - n2cos2_r_error <= dVar1) {
      local_bc = (uint)(local_70 - n2cos2_r_error < -dVar1);
    }
    else {
      local_bc = 0xffffffff;
    }
    x_local._4_4_ = local_bc;
  }
  else {
    x_local._4_4_ = 0xffffffff;
  }
  return x_local._4_4_;
}

Assistant:

int TriageCompareLineCos2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute cos^2(distance to edge).
  T cos_r = 1 - 0.5 * r2;
  T n2cos2_r = n2 * cos_r * cos_r;
  T n2cos2_r_error = 7 * T_ERR * n2cos2_r;

  // The length of M = X.CrossProd(N) is the cosine of the distance.
  T m2 = x.CrossProd(n).Norm2();
  T m1 = sqrt(m2);
  T m1_error = ((1 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T m2_error = 3 * T_ERR * m2 + (2 * m1 + m1_error) * m1_error;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to within a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2cos2_r *= x.Norm2();
    n2cos2_r_error += 4 * T_ERR * n2cos2_r;
  } else {
    n2cos2_r_error += 8 * DBL_ERR * n2cos2_r;
  }
  T diff = m2 - n2cos2_r;
  T error = m2_error + n2cos2_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}